

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::predict
          (FastText *this,istream *in,int32_t k,
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *predictions)

{
  bool bVar1;
  int32_t iVar2;
  element_type *input;
  element_type *this_00;
  value_type *in_RCX;
  undefined8 in_RSI;
  Model *in_RDI;
  const_iterator it;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> modelPredictions;
  Vector output;
  Vector hidden;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> words;
  value_type *in_stack_fffffffffffffea8;
  Vector *in_stack_fffffffffffffeb0;
  Vector *in_stack_fffffffffffffeb8;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  *this_01;
  element_type *in_stack_fffffffffffffec0;
  Dictionary *pDVar3;
  vector<int,_std::allocator<int>_> *line;
  string local_f0 [72];
  pair<float,_int> *local_a8;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_a0;
  undefined1 local_98 [72];
  element_type *in_stack_ffffffffffffffb0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  
  iVar2 = (int32_t)((ulong)in_RSI >> 0x20);
  line = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x139a85);
  pDVar3 = (Dictionary *)&stack0xffffffffffffffb0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x139a97);
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x139aa5);
  std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x139ac5);
  Dictionary::getLine((Dictionary *)in_stack_ffffffffffffffd0,(istream *)in_stack_ffffffffffffffc8,
                      (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc0,
                      (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb8._M_pi,
                      (minstd_rand *)in_stack_ffffffffffffffb0);
  input = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x139af8);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x139b07);
  Dictionary::addNgrams(pDVar3,line,iVar2);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
  if (bVar1) {
    local_98._56_4_ = 1;
  }
  else {
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x139b67);
    Vector::Vector(in_stack_fffffffffffffeb0,(int64_t)in_stack_fffffffffffffea8);
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x139b8b);
    iVar2 = Dictionary::nlabels(this_00);
    Vector::Vector(in_stack_fffffffffffffeb0,(int64_t)in_stack_fffffffffffffea8);
    pDVar3 = (Dictionary *)local_98;
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x139bc1);
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x139bcf);
    Model::predict(in_RDI,(vector<int,_std::allocator<int>_> *)input,iVar2,
                   (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)pDVar3,
                   (Vector *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x139c0a);
    local_a0._M_current =
         (pair<float,_int> *)
         std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::cbegin
                   ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                    in_stack_fffffffffffffea8);
    while( true ) {
      local_a8 = (pair<float,_int> *)
                 std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::cend
                           ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                             *)in_stack_fffffffffffffea8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          *)in_stack_fffffffffffffeb0,
                         (__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          *)in_stack_fffffffffffffea8);
      if (!bVar1) break;
      this_01 = &local_a0;
      in_stack_fffffffffffffea8 = in_RCX;
      in_stack_fffffffffffffeb0 =
           (Vector *)
           __gnu_cxx::
           __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
           ::operator->(this_01);
      in_stack_fffffffffffffec0 =
           std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139c83);
      __gnu_cxx::
      __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
      ::operator->(this_01);
      Dictionary::getLabel_abi_cxx11_(pDVar3,(int32_t)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      std::make_pair<float_const&,std::__cxx11::string>
                ((float *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffeb0);
      std::
      vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::
      pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x139cdf);
      std::__cxx11::string::~string(local_f0);
      __gnu_cxx::
      __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
      ::operator++(this_01,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    }
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
               in_stack_fffffffffffffec0);
    Vector::~Vector(in_stack_fffffffffffffeb0);
    Vector::~Vector(in_stack_fffffffffffffeb0);
    local_98._56_4_ = 0;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void FastText::predict(std::istream& in, int32_t k,
                       std::vector<std::pair<real,std::string>>& predictions) const {
  std::vector<int32_t> words, labels;
  dict_->getLine(in, words, labels, model_->rng);
  dict_->addNgrams(words, args_->wordNgrams);
  if (words.empty()) return;
  Vector hidden(args_->dim);
  Vector output(dict_->nlabels());
  std::vector<std::pair<real,int32_t>> modelPredictions;
  model_->predict(words, k, modelPredictions, hidden, output);
  predictions.clear();
  for (auto it = modelPredictions.cbegin(); it != modelPredictions.cend(); it++) {
    predictions.push_back(std::make_pair(it->first, dict_->getLabel(it->second)));
  }
}